

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkFinalize(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_34;
  int i;
  Abc_Obj_t *pDriverNew;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  
  for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = Abc_NtkCo(pNtk,local_34);
    pAVar2 = Abc_ObjFanin0(pObj_00);
    pAVar2 = Abc_ObjFanin0Ntk(pAVar2);
    pAVar2 = (pAVar2->field_6).pCopy;
    iVar1 = Abc_ObjFaninC0(pObj_00);
    pAVar2 = Abc_ObjNotCond(pAVar2,iVar1);
    Abc_ObjAddFanin((pObj_00->field_6).pCopy,pAVar2);
  }
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_NtkTimeInitialize(pNtkNew,pNtk);
  }
  if (pNtk->vPhases != (Vec_Int_t *)0x0) {
    Abc_NtkTransferPhases(pNtkNew,pNtk);
  }
  if (pNtk->pWLoadUsed != (char *)0x0) {
    pcVar3 = Abc_UtilStrsav(pNtk->pWLoadUsed);
    pNtkNew->pWLoadUsed = pcVar3;
  }
  return;
}

Assistant:

void Abc_NtkFinalize( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj, * pDriver, * pDriverNew;
    int i;
    // set the COs of the strashed network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver    = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pObj) );
        pDriverNew = Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pDriverNew );
    }
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
}